

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

void ply_ferror(p_ply ply,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined4 local_438;
  undefined4 local_434;
  va_list ap;
  char local_418 [8];
  char buffer [1024];
  char *fmt_local;
  p_ply ply_local;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_4e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_434 = 0x30;
  local_438 = 0x10;
  local_4d8 = in_RDX;
  local_4d0 = in_RCX;
  local_4c8 = in_R8;
  local_4c0 = in_R9;
  buffer._1016_8_ = fmt;
  vsprintf(local_418,fmt,&local_438);
  (*ply->error_cb)(ply,local_418);
  return;
}

Assistant:

static void ply_ferror(p_ply ply, const char *fmt, ...) {
    char buffer[1024];
    va_list ap;
    va_start(ap, fmt);
    vsprintf(buffer, fmt, ap);
    va_end(ap);
    ply->error_cb(ply, buffer);
}